

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oprom.c
# Opt level: O1

int igsc_image_oprom_has_4ids_extension
              (igsc_oprom_image *img,uint32_t request_type,_Bool *has_4ids_extension)

{
  _Bool _Var1;
  int iVar2;
  
  iVar2 = 3;
  if (((0xfffffffd < request_type - 3) && (img != (igsc_oprom_image *)0x0)) &&
     (iVar2 = 3, has_4ids_extension != (_Bool *)0x0)) {
    _Var1 = image_oprom_has_4ids_extension(img,request_type);
    *has_4ids_extension = _Var1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int igsc_image_oprom_has_4ids_extension(IN struct igsc_oprom_image *img,
                                        IN uint32_t request_type,
                                        OUT bool *has_4ids_extension)
{
    if (img == NULL || has_4ids_extension == NULL)
    {
        return IGSC_ERROR_INVALID_PARAMETER;
    }

    if (request_type != IGSC_OPROM_CODE && request_type != IGSC_OPROM_DATA)
    {
        return IGSC_ERROR_INVALID_PARAMETER;
    }

    *has_4ids_extension = image_oprom_has_4ids_extension(img, request_type);
    return IGSC_SUCCESS;
}